

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

void __thiscall
kj::_::
HeapDisposer<kj::_::AdapterPromiseNode<capnp::_::(anonymous_namespace)::RpcConnectionState::DisconnectInfo,_kj::_::PromiseAndFulfillerAdapter<capnp::_::(anonymous_namespace)::RpcConnectionState::DisconnectInfo>_>_>
::disposeImpl(HeapDisposer<kj::_::AdapterPromiseNode<capnp::_::(anonymous_namespace)::RpcConnectionState::DisconnectInfo,_kj::_::PromiseAndFulfillerAdapter<capnp::_::(anonymous_namespace)::RpcConnectionState::DisconnectInfo>_>_>
              *this,void *pointer)

{
  void *pointer_local;
  HeapDisposer<kj::_::AdapterPromiseNode<capnp::_::(anonymous_namespace)::RpcConnectionState::DisconnectInfo,_kj::_::PromiseAndFulfillerAdapter<capnp::_::(anonymous_namespace)::RpcConnectionState::DisconnectInfo>_>_>
  *this_local;
  
  if (pointer != (void *)0x0) {
    AdapterPromiseNode<capnp::_::(anonymous_namespace)::RpcConnectionState::DisconnectInfo,_kj::_::PromiseAndFulfillerAdapter<capnp::_::(anonymous_namespace)::RpcConnectionState::DisconnectInfo>_>
    ::~AdapterPromiseNode
              ((AdapterPromiseNode<capnp::_::(anonymous_namespace)::RpcConnectionState::DisconnectInfo,_kj::_::PromiseAndFulfillerAdapter<capnp::_::(anonymous_namespace)::RpcConnectionState::DisconnectInfo>_>
                *)pointer);
    operator_delete(pointer,0x1a8);
  }
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }